

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

BoxList * __thiscall amrex::BoxList::surroundingNodes(BoxList *this,int dir)

{
  int *piVar1;
  pointer pBVar2;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  Box *bx;
  pointer pBVar3;
  uint uVar4;
  
  __range1 = &this->m_lbox;
  pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar2 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar3 != pBVar2) {
    uVar4 = 1 << ((byte)dir & 0x1f);
    do {
      if (((pBVar3->btype).itype & uVar4) == 0) {
        piVar1 = (pBVar3->bigend).vect + dir;
        *piVar1 = *piVar1 + 1;
        (pBVar3->btype).itype = (pBVar3->btype).itype | uVar4;
      }
      pBVar3 = pBVar3 + 1;
    } while (pBVar3 != pBVar2);
  }
  return (BoxList *)__range1;
}

Assistant:

BoxList&
BoxList::surroundingNodes (int dir) noexcept
{
    for (auto& bx : m_lbox)
    {
        bx.surroundingNodes(dir);
    }
    return *this;
}